

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

void __thiscall FBackdropTexture::FBackdropTexture(FBackdropTexture *this)

{
  ulong *puVar1;
  undefined1 auVar2 [12];
  long lVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  int iVar9;
  int iVar10;
  undefined1 auVar8 [16];
  double dVar11;
  double dVar12;
  int iVar14;
  undefined1 auVar13 [16];
  double dVar15;
  undefined1 auVar16 [16];
  double dVar18;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_28;
  uint uVar17;
  int iVar19;
  
  lVar3 = 0;
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_006eebd0;
  (this->super_FTexture).Width = 0x90;
  (this->super_FTexture).Height = 0xa0;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\b';
  (this->super_FTexture).WidthMask = 0xff;
  this->LastRenderTic = 0;
  auVar8 = _DAT_005dc8a0;
  do {
    uVar17 = auVar8._8_4_;
    auVar16._4_4_ = 0;
    auVar16._0_4_ = uVar17;
    iVar19 = auVar8._12_4_;
    auVar16._8_4_ = iVar19;
    auVar16._12_4_ = 0;
    dVar11 = (double)DAT_005dc8b0;
    dVar12 = DAT_005dc8b0._8_8_;
    iVar14 = auVar8._4_4_;
    auVar13._0_8_ = auVar8._0_8_ & 0xffffffff;
    auVar13._8_4_ = iVar14;
    auVar13._12_4_ = 0;
    auVar13 = auVar13 | _DAT_005dc8b0;
    dVar15 = (SUB168(auVar16 | _DAT_005dc8b0,0) - dVar11) * 0.02454369260617026;
    dVar18 = (SUB168(auVar16 | _DAT_005dc8b0,8) - dVar12) * 0.02454369260617026;
    dVar6 = cos(dVar15);
    uStack_54 = (undefined4)((ulong)dVar15 >> 0x20);
    uStack_50 = SUB84(dVar18,0);
    uStack_4c = (undefined4)((ulong)dVar18 >> 0x20);
    auVar2._4_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = uStack_54;
    auVar7._0_8_ = auVar2._0_8_ << 0x20;
    auVar7._8_4_ = uStack_50;
    auVar7._12_4_ = uStack_4c;
    dVar15 = cos(auVar7._8_8_);
    dVar11 = cos((auVar13._0_8_ - dVar11) * 0.02454369260617026);
    dVar12 = cos((auVar13._8_8_ - dVar12) * 0.02454369260617026);
    iVar4 = (int)(dVar6 * 65536.0);
    iVar9 = (int)(dVar15 * 65536.0);
    iVar5 = (int)(dVar11 * 65536.0);
    iVar10 = (int)(dVar12 * 65536.0);
    local_28 = auVar8._0_4_;
    puVar1 = (ulong *)(&(this->super_FTexture).field_0x54 + lVar3 * 4);
    *puVar1 = CONCAT44((int)(dVar12 * 65536.0 - 2147483648.0),(int)(dVar11 * 65536.0 - 2147483648.0)
                      ) & CONCAT44(iVar10 >> 0x1f,iVar5 >> 0x1f) | CONCAT44(iVar10,iVar5);
    puVar1[1] = CONCAT44((int)(dVar15 * 65536.0 - 2147483648.0),
                         (int)(dVar6 * 65536.0 - 2147483648.0)) &
                CONCAT44(iVar9 >> 0x1f,iVar4 >> 0x1f) | CONCAT44(iVar9,iVar4);
    lVar3 = lVar3 + 4;
    auVar8._0_4_ = local_28 + 4;
    auVar8._4_4_ = iVar14 + 4;
    auVar8._8_4_ = uVar17 + 4;
    auVar8._12_4_ = iVar19 + 4;
  } while (lVar3 != 0x100);
  this->time1 = 0x80000000;
  this->time2 = 0x27d27d27;
  this->time3 = 0x46666666;
  this->time4 = 0xb60b60;
  this->t1ang = 0x40000000;
  this->t2ang = 0;
  this->z1ang = 0;
  this->z2ang = 0x20000000;
  return;
}

Assistant:

FBackdropTexture::FBackdropTexture()
{
	Width = 144;
	Height = 160;
	WidthBits = 8;
	HeightBits = 8;
	WidthMask = 255;
	LastRenderTic = 0;

	for (int i = 0; i < COS_SIZE; ++i)
	{
		costab[i] = uint32_t(cos(i * (M_PI / (COS_SIZE / 2))) * 65536);
	}

	time1 = DEGREES(180);
	time2 = DEGREES(56);
	time3 = DEGREES(99);
	time4 = DEGREES(1);
	t1ang = DEGREES(90);
	t2ang = 0;
	z1ang = 0;
	z2ang = DEGREES(45);
}